

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O3

void predict_or_learn<true,false>(cs_active *cs_a,single_learner *base,example *ec)

{
  v_array<lq_data> *this;
  uint64_t *puVar1;
  unsigned_long *puVar2;
  vw *all;
  lq_data *plVar3;
  wclass *pwVar4;
  single_learner *psVar5;
  bool query_this_label;
  ostream *poVar6;
  long *plVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  v_array<lq_data> *__range2;
  lq_data *lqd;
  ulong uVar11;
  label_t lVar12;
  bool *query_needed;
  lq_data *plVar13;
  uint uVar14;
  wclass *__begin2;
  label_t lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  lq_data *local_240;
  float local_238;
  float local_234;
  double local_230;
  v_array<unsigned_int> *local_228;
  single_learner *local_220;
  example *local_218;
  size_t local_210;
  label_t local_208;
  label_t local_200;
  wclass **local_1f8;
  ulong local_1f0;
  wclass *local_1e8;
  size_t sStack_1e0;
  string local_1d8;
  stringstream filename;
  undefined1 local_1a8 [376];
  
  local_208 = (label_t)(ec->l).cs.costs._begin;
  lVar12 = (label_t)(ec->l).cs.costs._end;
  local_1e8 = (ec->l).cs.costs.end_array;
  sStack_1e0 = (ec->l).cs.costs.erase_count;
  uVar11 = cs_a->all->sd->queries;
  uVar9 = (ulong)cs_a->num_classes;
  local_220 = base;
  local_218 = ec;
  local_200 = lVar12;
  if (cs_a->min_labels * uVar9 <= uVar11) {
    std::__cxx11::stringstream::stringstream((stringstream *)&filename);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(cs_a->all->final_regressor_name)._M_dataplus._M_p,
                        (cs_a->all->final_regressor_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    all = cs_a->all;
    std::__cxx11::stringbuf::str();
    VW::save_predictor(all,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Number of examples with at least one query = ",0x2d);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    cs_a->min_labels = cs_a->min_labels << 1;
    if ((cs_a->examples_by_queries)._end != (cs_a->examples_by_queries)._begin) {
      uVar11 = 0;
      do {
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
        std::ostream::put('P');
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"examples with ",0xe);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," labels queried = ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)(cs_a->examples_by_queries)._end -
                                (long)(cs_a->examples_by_queries)._begin >> 3));
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    lVar12 = local_200;
    ec = local_218;
    std::ostream::put('P');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"labels outside of cost range = ",0x1f);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"average distance to range = ",0x1c);
    std::ostream::_M_insert<double>
              ((double)(cs_a->distance_to_range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    poVar6 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"average range = ",0x10);
    std::ostream::_M_insert<double>((double)(cs_a->range / (float)cs_a->labels_outside_range));
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    plVar7 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__cxx11::stringstream::~stringstream((stringstream *)&filename);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    uVar11 = cs_a->all->sd->queries;
    uVar9 = (ulong)cs_a->num_classes;
  }
  lVar15 = local_208;
  if (uVar11 < uVar9 * cs_a->max_labels) {
    local_234 = 1.4013e-45;
    local_238 = 3.4028235e+38;
    (ec->l).cs.costs._begin = (wclass *)0x0;
    (ec->l).simple.initial = 0.0;
    uVar11 = cs_a->t;
    local_1f8 = &(ec->l).cs.costs.end_array;
    fVar17 = (float)uVar11 + -1.0;
    local_228._0_4_ = (cs_a->cost_max - cs_a->cost_min) * cs_a->c1;
    local_230._0_4_ = cs_a->c0;
    fVar16 = 1.0;
    if (1.0 <= fVar17) {
      fVar16 = fVar17;
    }
    fVar16 = logf(fVar16 * (float)cs_a->num_classes);
    psVar5 = local_220;
    if (lVar12 == lVar15) {
      if (cs_a->num_classes == 0) {
        fVar16 = 1.4013e-45;
      }
      else {
        fVar17 = 3.4028235e+38;
        fVar16 = 1.4013e-45;
        fVar19 = 1.4013e-45;
        do {
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(psVar5 + 0xe0) * ((int)fVar19 + -1));
          (**(code **)(psVar5 + 0x30))
                    (*(undefined8 *)(psVar5 + 0x18),*(undefined8 *)(psVar5 + 0x20),ec);
          puVar1 = &(ec->super_example_predict).ft_offset;
          *puVar1 = *puVar1 - (ulong)(uint)(((int)fVar19 + -1) * *(int *)(psVar5 + 0xe0));
          fVar18 = ec->partial_prediction;
          if ((fVar18 < fVar17) || ((uint)fVar19 < (uint)fVar16 && fVar18 == fVar17)) {
            fVar17 = fVar18;
            fVar16 = fVar19;
          }
          if (ec->passthrough != (features *)0x0) {
            features::push_back(ec->passthrough,fVar18,(ulong)(uint)fVar19 ^ 0x398d9fda640553);
          }
          fVar19 = (float)((int)fVar19 + 1);
        } while ((uint)fVar19 <= cs_a->num_classes);
      }
    }
    else {
      fVar17 = cs_a->cost_max - cs_a->cost_min;
      local_230 = (double)CONCAT44(local_230._4_4_,fVar17 * fVar17 * local_230._0_4_ * fVar16);
      local_228 = (v_array<unsigned_int> *)
                  CONCAT44(local_228._4_4_,local_228._0_4_ / SQRT((float)uVar11));
      this = &cs_a->query_data;
      do {
        _filename = 0;
        local_1a8._0_8_ = lVar15;
        v_array<lq_data>::push_back(this,(lq_data *)&filename);
        psVar5 = local_220;
        lVar15 = (label_t)((long)lVar15 + 0x10);
      } while (lVar15 != lVar12);
      plVar13 = (cs_a->query_data)._begin;
      plVar3 = (cs_a->query_data)._end;
      if (plVar13 == plVar3) {
        sVar10 = cs_a->all->sd->queries;
      }
      else {
        fVar16 = 3.4028235e+38;
        do {
          find_cost_range(cs_a,psVar5,ec,plVar13->cl->class_index,local_230._0_4_,local_228._0_4_,
                          &plVar13->min_pred,&plVar13->max_pred,&plVar13->is_range_large);
          fVar17 = plVar13->max_pred;
          if (fVar16 <= plVar13->max_pred) {
            fVar17 = fVar16;
          }
          plVar13 = plVar13 + 1;
          fVar16 = fVar17;
        } while (plVar13 != plVar3);
        plVar13 = (cs_a->query_data)._begin;
        local_240 = (cs_a->query_data)._end;
        uVar14 = 0;
        if (plVar13 != local_240) {
          do {
            fVar16 = plVar13->min_pred;
            plVar13->is_range_overlapped = fVar17 >= fVar16;
            if (fVar17 < fVar16) {
              uVar11 = 0;
            }
            else {
              uVar11 = (ulong)plVar13->is_range_large ^ 1;
            }
            cs_a->overlapped_and_range_small = cs_a->overlapped_and_range_small + uVar11;
            fVar19 = plVar13->cl->x;
            if ((plVar13->max_pred <= fVar19 && fVar19 != plVar13->max_pred) ||
               (fVar19 < plVar13->min_pred)) {
              cs_a->labels_outside_range = cs_a->labels_outside_range + 1;
              fVar19 = plVar13->cl->x;
              fVar18 = fVar19 - plVar13->max_pred;
              fVar19 = plVar13->min_pred - fVar19;
              if (fVar19 <= fVar18) {
                fVar19 = fVar18;
              }
              cs_a->distance_to_range = fVar19 + cs_a->distance_to_range;
              cs_a->range = (plVar13->max_pred - plVar13->min_pred) + cs_a->range;
            }
            uVar14 = uVar14 + (fVar16 <= fVar17);
            plVar13 = plVar13 + 1;
          } while (plVar13 != local_240);
          plVar13 = (cs_a->query_data)._begin;
          local_240 = (cs_a->query_data)._end;
        }
        local_210 = cs_a->all->sd->queries;
        sVar10 = local_210;
        if (plVar13 != local_240) {
          local_228 = (v_array<unsigned_int> *)&ec->pred;
          local_230 = (double)local_230._0_4_;
          local_1f0 = (ulong)uVar14;
          query_needed = &plVar13->query_needed;
          do {
            if (uVar14 < 2) {
              if (cs_a->use_domination == false) {
LAB_001e461e:
                query_this_label = query_needed[-2];
              }
              else {
LAB_001e45fc:
                query_this_label = false;
              }
            }
            else {
              query_this_label = true;
              if ((cs_a->is_baseline == false) &&
                 ((cs_a->use_domination != false || (query_needed[-2] == false)))) {
                if (query_needed[-1] == true) goto LAB_001e461e;
                goto LAB_001e45fc;
              }
            }
            pwVar4 = *(wclass **)(query_needed + 6);
            inner_loop<true,false>
                      (cs_a,local_220,local_218,pwVar4->class_index,pwVar4->x,(uint32_t *)&local_234
                       ,&local_238,&pwVar4->partial_prediction,query_this_label,query_needed);
            if (*query_needed == true) {
              v_array<unsigned_int>::push_back
                        (local_228,&(*(wclass **)(query_needed + 6))->class_index);
            }
            if (cs_a->print_debug_stuff == true) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"label=",6);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," x=",3);
              poVar6 = std::ostream::_M_insert<double>((double)(*(wclass **)(query_needed + 6))->x);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," prediction=",0xc);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," score=",7);
              poVar6 = std::ostream::_M_insert<double>((double)local_238);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," pp=",4);
              poVar6 = std::ostream::_M_insert<double>
                                 ((double)(*(wclass **)(query_needed + 6))->partial_prediction);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ql=",4);
              poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," qn=",4);
              poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," ro=",4);
              poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," rl=",4);
              poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
              poVar6 = std::ostream::_M_insert<double>((double)*(float *)(query_needed + -6));
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
              poVar6 = std::ostream::_M_insert<double>
                                 ((double)((lq_data *)(query_needed + -10))->max_pred);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] vs delta=",0xb);
              poVar6 = std::ostream::_M_insert<double>(local_230);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," n_overlapped=",0xe);
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," is_baseline=",0xd);
              poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
              std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
            }
            plVar13 = (lq_data *)(query_needed + 0xe);
            query_needed = query_needed + 0x18;
          } while (plVar13 != local_240);
          plVar13 = this->_begin;
          sVar10 = local_210;
          ec = local_218;
        }
      }
      if (plVar13 != (lq_data *)0x0) {
        free(plVar13);
      }
      this->_begin = (lq_data *)0x0;
      (cs_a->query_data)._end = (lq_data *)0x0;
      (cs_a->query_data).end_array = (lq_data *)0x0;
      sVar8 = sVar10;
      if (cs_a->all->sd->queries != sVar10) {
        cs_a->num_any_queries = cs_a->num_any_queries + 1;
        sVar8 = cs_a->all->sd->queries;
      }
      puVar2 = (cs_a->examples_by_queries)._begin + (sVar8 - sVar10);
      *puVar2 = *puVar2 + 1;
      ec->partial_prediction = local_238;
      cs_a->t = cs_a->t + 1;
      fVar16 = local_234;
    }
    (ec->pred).scalar = fVar16;
    (ec->l).multi = local_208;
    (ec->l).cs.costs._end = (wclass *)local_200;
    *local_1f8 = local_1e8;
    local_1f8[1] = (wclass *)sStack_1e0;
  }
  return;
}

Assistant:

void predict_or_learn(cs_active& cs_a, single_learner& base, example& ec)
{
  // cerr << "------------- passthrough" << endl;
  COST_SENSITIVE::label ld = ec.l.cs;

  // cerr << "is_learn=" << is_learn << " ld.costs.size()=" << ld.costs.size() << endl;
  if (cs_a.all->sd->queries >= cs_a.min_labels * cs_a.num_classes)
  {
    // save regressor
    stringstream filename;
    filename << cs_a.all->final_regressor_name << "." << ec.example_counter << "." << cs_a.all->sd->queries << "."
             << cs_a.num_any_queries;
    VW::save_predictor(*(cs_a.all), filename.str());
    cerr << endl << "Number of examples with at least one query = " << cs_a.num_any_queries;
    // Double label query budget
    cs_a.min_labels *= 2;
    for (size_t i = 0; i < cs_a.examples_by_queries.size(); i++)
    {
      cerr << endl << "examples with " << i << " labels queried = " << cs_a.examples_by_queries[i];
    }

    cerr << endl << "labels outside of cost range = " << cs_a.labels_outside_range;
    cerr << endl << "average distance to range = " << cs_a.distance_to_range / ((float)cs_a.labels_outside_range);
    cerr << endl << "average range = " << cs_a.range / ((float)cs_a.labels_outside_range);

    /*
    for (size_t i=0; i<cs_a.all->sd->distance_to_range.size(); i++)
    {  cerr << endl << "label " << i << ", average distance to range = " <<
    cs_a.all->sd->distance_to_range[i]/((float)(cs_a.t-1));
    }*/

    cerr << endl << endl;
  }

  if (cs_a.all->sd->queries >= cs_a.max_labels * cs_a.num_classes)
    return;

  uint32_t prediction = 1;
  float score = FLT_MAX;
  ec.l.simple = {0., 0., 0.};

  float min_max_cost = FLT_MAX;
  float t = (float)cs_a.t;  // ec.example_t;  // current round
  float t_prev = t - 1.f;   // ec.weight; // last round

  float eta = cs_a.c1 * (cs_a.cost_max - cs_a.cost_min) / sqrt(t);  // threshold on cost range
  float delta = cs_a.c0 * log((float)(cs_a.num_classes * max(t_prev, 1.f))) *
      pow(cs_a.cost_max - cs_a.cost_min, 2);  // threshold on empirical loss difference

  if (ld.costs.size() > 0)
  {
    // Create metadata structure
    for (COST_SENSITIVE::wclass& cl : ld.costs)
    {
      lq_data f = {0.0, 0.0, 0, 0, 0, cl};
      cs_a.query_data.push_back(f);
    }
    uint32_t n_overlapped = 0;
    for (lq_data& lqd : cs_a.query_data)
    {
      find_cost_range(cs_a, base, ec, lqd.cl.class_index, delta, eta, lqd.min_pred, lqd.max_pred, lqd.is_range_large);
      min_max_cost = min(min_max_cost, lqd.max_pred);
    }
    for (lq_data& lqd : cs_a.query_data)
    {
      lqd.is_range_overlapped = (lqd.min_pred <= min_max_cost);
      n_overlapped += (uint32_t)(lqd.is_range_overlapped);
      // large_range = large_range || (cl.is_range_overlapped && cl.is_range_large);
      // if(cl.is_range_overlapped && is_learn)
      //{ cout << "label " << cl.class_index << ", min_pred = " << cl.min_pred << ", max_pred = " << cl.max_pred << ",
      // is_range_large = " << cl.is_range_large << ", eta = " << eta << ", min_max_cost = " << min_max_cost << endl;
      //}
      cs_a.overlapped_and_range_small += (size_t)(lqd.is_range_overlapped && !lqd.is_range_large);
      if (lqd.cl.x > lqd.max_pred || lqd.cl.x < lqd.min_pred)
      {
        cs_a.labels_outside_range++;
        // cs_a.all->sd->distance_to_range[cl.class_index-1] += max(cl.x - cl.max_pred, cl.min_pred - cl.x);
        cs_a.distance_to_range += max(lqd.cl.x - lqd.max_pred, lqd.min_pred - lqd.cl.x);
        cs_a.range += lqd.max_pred - lqd.min_pred;
      }
    }

    bool query = (n_overlapped > 1);
    size_t queries = cs_a.all->sd->queries;
    // bool any_query = false;
    for (lq_data& lqd : cs_a.query_data)
    {
      bool query_label = ((query && cs_a.is_baseline) || (!cs_a.use_domination && lqd.is_range_large) ||
          (query && lqd.is_range_overlapped && lqd.is_range_large));
      inner_loop<is_learn, is_simulation>(cs_a, base, ec, lqd.cl.class_index, lqd.cl.x, prediction, score,
          lqd.cl.partial_prediction, query_label, lqd.query_needed);
      if (lqd.query_needed)
        ec.pred.multilabels.label_v.push_back(lqd.cl.class_index);
      if (cs_a.print_debug_stuff)
        cerr << "label=" << lqd.cl.class_index << " x=" << lqd.cl.x << " prediction=" << prediction
             << " score=" << score << " pp=" << lqd.cl.partial_prediction << " ql=" << query_label
             << " qn=" << lqd.query_needed << " ro=" << lqd.is_range_overlapped << " rl=" << lqd.is_range_large << " ["
             << lqd.min_pred << ", " << lqd.max_pred << "] vs delta=" << delta << " n_overlapped=" << n_overlapped
             << " is_baseline=" << cs_a.is_baseline << endl;
    }

    // Need to pop metadata
    cs_a.query_data.delete_v();

    if (cs_a.all->sd->queries - queries > 0)
      cs_a.num_any_queries++;

    cs_a.examples_by_queries[cs_a.all->sd->queries - queries] += 1;
    // if(any_query)
    // cs_a.num_any_queries++;

    ec.partial_prediction = score;
    if (is_learn)
    {
      cs_a.t++;
    }
  }
  else
  {
    float temp = 0.f;
    bool temp2 = false, temp3 = false;
    for (uint32_t i = 1; i <= cs_a.num_classes; i++)
    {
      inner_loop<false, is_simulation>(cs_a, base, ec, i, FLT_MAX, prediction, score, temp, temp2, temp3);
    }
  }

  ec.pred.multiclass = prediction;
  ec.l.cs = ld;
}